

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.hpp
# Opt level: O0

void __thiscall trng::mrg4::jump(mrg4 *this,unsigned_long_long s)

{
  ulong in_RSI;
  mrg4 *in_RDI;
  uint i_1;
  uint i;
  uint in_stack_0000009c;
  mrg4 *in_stack_000000a0;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  if (in_RSI < 0x10) {
    for (local_14 = 0; local_14 < in_RSI; local_14 = local_14 + 1) {
      step(in_RDI);
    }
  }
  else {
    for (; local_10 != 0; local_10 = local_10 >> 1) {
      if ((local_10 & 1) == 1) {
        jump2(in_stack_000000a0,in_stack_0000009c);
      }
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg4::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      unsigned int i(0);
      while (s > 0) {
        if (s % 2 == 1)
          jump2(i);
        ++i;
        s >>= 1u;
      }
    }
  }